

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
          *base,tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
                *generators,bool is_end)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
  *in_RSI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *in_RDI;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff58;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff60;
  ParamGenerator<(anonymous_namespace)::uniformTileConfigParam> *in_stack_ffffffffffffff68;
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  *in_stack_ffffffffffffff70;
  
  ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
  ::ParamIteratorInterface
            (&in_RDI->
              super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
            );
  (in_RDI->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01f5b9f0;
  in_RDI->base_ = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660b8d);
  ParamGenerator<const_libaom_test::CodecFactory_*>::begin
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660bac);
  ParamGenerator<libaom_test::TestMode>::begin
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660bc8);
  ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>::begin(in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660be4);
  ParamGenerator<aom_rc_mode>::begin((ParamGenerator<aom_rc_mode> *)in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff60,
             (ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)
             in_stack_ffffffffffffff58,(ParamIterator<aom_rc_mode> *)0x660c14);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x660c20);
  ParamIterator<(anonymous_namespace)::uniformTileConfigParam>::~ParamIterator
            ((ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)0x660c2a);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x660c34);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x660c41);
  std::
  get<0ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660c5c);
  ParamGenerator<const_libaom_test::CodecFactory_*>::end
            ((ParamGenerator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68);
  std::
  get<1ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660c78);
  ParamGenerator<libaom_test::TestMode>::end
            ((ParamGenerator<libaom_test::TestMode> *)in_stack_ffffffffffffff68);
  std::
  get<2ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660c94);
  ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>::end(in_stack_ffffffffffffff68);
  std::
  get<3ul,testing::internal::ParamGenerator<libaom_test::CodecFactory_const*>,testing::internal::ParamGenerator<libaom_test::TestMode>,testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,testing::internal::ParamGenerator<aom_rc_mode>>
            ((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamGenerator<aom_rc_mode>_>
              *)0x660cb0);
  ParamGenerator<aom_rc_mode>::end((ParamGenerator<aom_rc_mode> *)in_stack_ffffffffffffff68);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>,_true,_true>
            (in_stack_ffffffffffffff70,
             (ParamIterator<const_libaom_test::CodecFactory_*> *)in_stack_ffffffffffffff68,
             (ParamIterator<libaom_test::TestMode> *)in_stack_ffffffffffffff60,
             (ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)
             in_stack_ffffffffffffff58,(ParamIterator<aom_rc_mode> *)0x660cdd);
  ParamIterator<aom_rc_mode>::~ParamIterator((ParamIterator<aom_rc_mode> *)0x660ce9);
  ParamIterator<(anonymous_namespace)::uniformTileConfigParam>::~ParamIterator
            ((ParamIterator<(anonymous_namespace)::uniformTileConfigParam> *)0x660cf3);
  ParamIterator<libaom_test::TestMode>::~ParamIterator
            ((ParamIterator<libaom_test::TestMode> *)0x660cfd);
  ParamIterator<const_libaom_test::CodecFactory_*>::~ParamIterator
            ((ParamIterator<const_libaom_test::CodecFactory_*> *)0x660d07);
  std::
  tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::uniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
  ::tuple(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
  ::shared_ptr((shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::uniformTileConfigParam,_aom_rc_mode>_>
                *)0x660d61);
  ComputeCurrentValue(in_RDI);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }